

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kapi.cpp
# Opt level: O3

string * __thiscall
Kraken::KAPI::public_method(string *__return_storage_ptr__,KAPI *this,string *method,Input *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  char *pcVar5;
  runtime_error *this_00;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  string method_url;
  string path;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  
  std::operator+(&local_228,"/",&this->version_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_198 = *puVar6;
    lStack_190 = plVar3[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *puVar6;
    local_1a8 = (ulong *)*plVar3;
  }
  local_1a0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1a8,(ulong)(method->_M_dataplus)._M_p);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208.field_2._8_8_ = plVar3[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_208._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  paVar1 = &local_228.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  std::operator+(&local_1c8,&this->url_,&local_208);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_198 = *puVar6;
    lStack_190 = plVar3[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *puVar6;
    local_1a8 = (ulong *)*plVar3;
  }
  local_1a0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  build_query(&local_1e8,input);
  uVar8 = 0xf;
  if (local_1a8 != &local_198) {
    uVar8 = local_198;
  }
  if (uVar8 < local_1e8._M_string_length + local_1a0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar9 = local_1e8.field_2._M_allocated_capacity;
    }
    if (local_1e8._M_string_length + local_1a0 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_1a8);
      goto LAB_00105750;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1e8._M_dataplus._M_p);
LAB_00105750:
  psVar7 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_228.field_2._M_allocated_capacity = *psVar7;
    local_228.field_2._8_8_ = puVar4[3];
    local_228._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar7;
    local_228._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_228._M_string_length = puVar4[1];
  *puVar4 = psVar7;
  puVar4[1] = 0;
  *(undefined1 *)psVar7 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  curl_easy_setopt(this->curl_,0x2712,local_228._M_dataplus._M_p);
  curl_easy_setopt(this->curl_,0x2727,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  curl_easy_setopt(this->curl_,0x2711,__return_storage_ptr__);
  curl_easy_setopt(this->curl_,0x50,1);
  iVar2 = curl_easy_perform(this->curl_);
  if (iVar2 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"curl_easy_perform() failed: ",0x1c);
  pcVar5 = (char *)curl_easy_strerror(iVar2);
  std::operator<<((ostream *)&local_1a8,pcVar5);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,(string *)&local_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KAPI::public_method(const std::string& method, 
				const KAPI::Input& input) const
{
   // build method URL
   std::string path = "/" + version_ + "/public/" + method;
   std::string method_url = url_ + path + "?" + build_query(input);
   curl_easy_setopt(curl_, CURLOPT_URL, method_url.c_str());

   // reset the http header
   curl_easy_setopt(curl_, CURLOPT_HTTPHEADER, NULL);

   // where CURL write callback function stores the response
   std::string response;
   curl_easy_setopt(curl_, CURLOPT_WRITEDATA, static_cast<void*>(&response));

   // Set GET method
   curl_easy_setopt(curl_, CURLOPT_HTTPGET, 1L);

   // perform CURL request
   CURLcode result = curl_easy_perform(curl_);
   if (result != CURLE_OK) {
      std::ostringstream oss;  
      oss << "curl_easy_perform() failed: "<< curl_easy_strerror(result);
      throw std::runtime_error(oss.str());
   }

   return response;
}